

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_stream_start(cubeb_stream_conflict *stm)

{
  cubeb_log_level cVar1;
  pa_mainloop_api *ppVar2;
  cubeb_log_callback p_Var3;
  long *in_RDI;
  cork_state in_stack_ffffffffffffffec;
  cubeb_stream_conflict *in_stack_fffffffffffffff0;
  _func_void_pa_mainloop_api_ptr__func_void_pa_mainloop_api_ptr_void_ptr_ptr_void_ptr *p_Var4;
  
  *(undefined4 *)(in_RDI + 10) = 0;
  stream_cork(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  if ((in_RDI[2] != 0) && (in_RDI[3] == 0)) {
    (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
    p_Var4 = cubeb_pa_mainloop_api_once;
    ppVar2 = (*cubeb_pa_threaded_mainloop_get_api)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
    (*p_Var4)(ppVar2,pulse_defer_event_cb,in_RDI);
    (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
  }
  cVar1 = cubeb_log_get_level();
  if (cVar1 != CUBEB_LOG_DISABLED) {
    p_Var3 = cubeb_log_get_callback();
    if (p_Var3 != (cubeb_log_callback)0x0) {
      cubeb_log_internal("cubeb_pulse.c",0x45b,"Cubeb stream (%p) started successfully.",in_RDI);
    }
  }
  return 0;
}

Assistant:

static int
pulse_stream_start(cubeb_stream * stm)
{
  stm->shutdown = 0;
  stream_cork(stm, UNCORK | NOTIFY);

  if (stm->output_stream && !stm->input_stream) {
    /* On output only case need to manually call user cb once in order to make
     * things roll. This is done via a defer event in order to execute it
     * from PA server thread. */
    WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
    WRAP(pa_mainloop_api_once)
    (WRAP(pa_threaded_mainloop_get_api)(stm->context->mainloop),
     pulse_defer_event_cb, stm);
    WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);
  }

  LOG("Cubeb stream (%p) started successfully.", stm);
  return CUBEB_OK;
}